

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O2

void anon_unknown.dwarf_2bb02::generateRandomScanFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  int k;
  PixelType PVar9;
  int k_1;
  uint uVar10;
  long lVar11;
  int i;
  ulong uVar12;
  int j;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float f;
  Array<Imf_3_2::Array2D<void_*>_> data;
  anon_class_8_1_26b32173 generate_random_int;
  DeepScanLineOutputFile file;
  int type;
  default_random_engine generator;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  ostream local_1e0 [376];
  Channel local_68 [56];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"  generating deep scanline file \'");
  poVar4 = std::operator<<(poVar4,(string *)filename);
  poVar4 = std::operator<<(poVar4,"\' compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,compression);
  std::endl<char,std::char_traits<char>>(poVar4);
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  generate_random_int.generator = &generator;
  generator._M_x = 1;
  if (DAT_0016e968 != (anonymous_namespace)::channelTypes) {
    DAT_0016e968 = (anonymous_namespace)::channelTypes;
  }
  uVar10 = 0;
  uVar8 = 0;
  if (0 < channelCount) {
    uVar8 = channelCount;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    type = generateRandomScanFile::anon_class_8_1_26b32173::operator()(&generate_random_int,3);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,uVar10);
    std::__cxx11::stringbuf::str();
    if (type == 0) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,(Channel *)&frameBuffer);
    }
    if (type == 1) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,(Channel *)&frameBuffer);
    }
    if (type == 2) {
      psVar5 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar5,(Channel *)&frameBuffer);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
    std::__cxx11::string::~string((string *)&frameBuffer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(long)channelCount);
  uVar15 = (ulong)uVar8;
  for (lVar13 = 0; uVar15 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + lVar13),0xa9,0x111);
  }
  Imf_3_2::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCountScans,0xa9,0x111);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCountScans._16_8_ +
                      (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_0016e944 * -0x444),4,
             0x444,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  lVar13 = 0x10;
  for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar12 * 4);
    PVar9 = (uint)(PVar1 != UINT) * 3;
    if (PVar1 == HALF) {
      PVar9 = PVar1;
    }
    if (PVar1 == FLOAT) {
      PVar9 = PVar1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,(int)uVar12);
    std::__cxx11::stringbuf::str();
    iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
    uVar16 = (ulong)(iVar3 == 0) << 2;
    if (iVar3 == 1) {
      uVar16 = 2;
    }
    if (iVar3 == 2) {
      uVar16 = 4;
    }
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)local_68,PVar9,
               (char *)(*(long *)((long)&(data._data)->_sizeX + lVar13) +
                        (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_0016e944 * -0x888),
               8,0x888,uVar16,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    lVar13 = lVar13 + 0x18;
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  for (lVar13 = 0; lVar13 != 0xa9; lVar13 = lVar13 + 1) {
    for (lVar14 = 0; lVar14 != 0x111; lVar14 = lVar14 + 1) {
      iVar3 = generateRandomScanFile::anon_class_8_1_26b32173::operator()(&generate_random_int,10);
      lVar7 = (anonymous_namespace)::sampleCountScans._16_8_;
      lVar17 = (anonymous_namespace)::sampleCountScans._8_8_;
      *(int *)((anonymous_namespace)::sampleCountScans._16_8_ +
               (anonymous_namespace)::sampleCountScans._8_8_ * lVar13 * 4 + lVar14 * 4) = iVar3 + 1;
      uVar8 = (uint)((int)lVar13 * 0x111 + (int)lVar14) % 0x801;
      f = (float)uVar8;
      for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
        iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
        if (iVar3 == 0) {
          pvVar6 = operator_new__((ulong)*(uint *)(lVar7 + lVar17 * lVar13 * 4 + lVar14 * 4) << 2);
          data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar14] = pvVar6;
          iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          lVar7 = (anonymous_namespace)::sampleCountScans._16_8_;
        }
        if (iVar3 == 1) {
          pvVar6 = operator_new__((ulong)*(uint *)(lVar7 + lVar17 * lVar13 * 4 + lVar14 * 4) * 2);
          data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar14] = pvVar6;
          iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          lVar7 = (anonymous_namespace)::sampleCountScans._16_8_;
        }
        if (iVar3 == 2) {
          pvVar6 = operator_new__((ulong)*(uint *)(lVar7 + lVar17 * lVar13 * 4 + lVar14 * 4) << 2);
          data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar14] = pvVar6;
          lVar7 = (anonymous_namespace)::sampleCountScans._16_8_;
        }
        lVar11 = 0;
        for (uVar16 = 0; lVar2 = (anonymous_namespace)::channelTypes,
            uVar16 < *(uint *)(lVar7 + lVar17 * lVar13 * 4 + lVar14 * 4); uVar16 = uVar16 + 1) {
          iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          if (iVar3 == 0) {
            *(uint *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar14] +
                     lVar11 * 2) = uVar8;
            iVar3 = *(int *)(lVar2 + uVar12 * 4);
          }
          if (iVar3 == 1) {
            Imath_3_2::half::operator=
                      ((half *)((long)data._data[uVar12]._data
                                      [data._data[uVar12]._sizeY * lVar13 + lVar14] + lVar11),f);
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            lVar7 = (anonymous_namespace)::sampleCountScans._16_8_;
            lVar17 = (anonymous_namespace)::sampleCountScans._8_8_;
          }
          if (iVar3 == 2) {
            *(float *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar14] +
                      lVar11 * 2) = f;
          }
          lVar11 = lVar11 + 2;
        }
      }
    }
  }
  Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  lVar13 = 0;
  do {
    if (lVar13 == 0xa9) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  --> done");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      return;
    }
    for (lVar14 = 0; lVar14 != 0x111; lVar14 = lVar14 + 1) {
      lVar17 = 4;
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
        if (iVar3 == 0) {
          pvVar6 = *(void **)(*(long *)((long)data._data + lVar17 * 4 + -8) * lVar13 * 8 +
                              *(long *)((long)&(data._data)->_sizeX + lVar17 * 4) + lVar14 * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            goto LAB_001125b6;
          }
        }
        else {
LAB_001125b6:
          if (iVar3 == 1) {
            pvVar6 = *(void **)(*(long *)((long)data._data + lVar17 * 4 + -8) * lVar13 * 8 +
                                *(long *)((long)&(data._data)->_sizeX + lVar17 * 4) + lVar14 * 8);
            if (pvVar6 == (void *)0x0) goto LAB_00112613;
            operator_delete__(pvVar6);
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if ((iVar3 == 2) &&
             (pvVar6 = *(void **)(*(long *)((long)data._data + lVar17 * 4 + -8) * lVar13 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar17 * 4) + lVar14 * 8),
             pvVar6 != (void *)0x0)) {
            operator_delete__(pvVar6);
          }
        }
LAB_00112613:
        lVar17 = lVar17 + 6;
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void
generateRandomScanFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep scanline file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCountScans.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCountScans[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        //
        // Fill in data at the last minute.
        //

        for (int j = 0; j < width; j++)
        {
            sampleCountScans[i][j] = generate_random_int (10) + 1;
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    data[k][i][j] = new unsigned int[sampleCountScans[i][j]];
                if (channelTypes[k] == 1)
                    data[k][i][j] = new half[sampleCountScans[i][j]];
                if (channelTypes[k] == 2)
                    data[k][i][j] = new float[sampleCountScans[i][j]];
                for (unsigned int l = 0; l < sampleCountScans[i][j]; l++)
                {
                    if (channelTypes[k] == 0)
                        ((unsigned int*) data[k][i][j])[l] =
                            (i * width + j) % 2049;
                    if (channelTypes[k] == 1)
                        ((half*) data[k][i][j])[l] = (i * width + j) % 2049;
                    if (channelTypes[k] == 2)
                        ((float*) data[k][i][j])[l] = (i * width + j) % 2049;
                }
            }
        }
    }

    file.writePixels (height);

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }

    std::cout << "  --> done" << std::endl;
}